

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::build(BVHNSubdivPatch1MBlurBuilderSAH<4> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  BVHN<4> *pBVar4;
  BBox<embree::Vec3fa> *pBVar5;
  char *ptr;
  size_t sVar6;
  PrimRefMB *pPVar7;
  MemoryMonitorInterface *pMVar8;
  undefined8 uVar9;
  size_t i_2;
  PrimRefMB *pPVar10;
  BBox<embree::Vec3fa> *pBVar11;
  char *pcVar12;
  ulong uVar13;
  size_t i;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  EVP_PKEY_CTX *ctx;
  size_t i_1;
  size_t sVar17;
  ulong uVar18;
  size_t numSubPatchesMB;
  double local_4cb0;
  size_t numSubPatches;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4c88;
  undefined8 local_4c78;
  undefined8 uStack_4c70;
  undefined8 local_4c68;
  undefined8 uStack_4c60;
  undefined8 local_4c58;
  undefined8 uStack_4c50;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  
  if ((this->scene->world).numMBSubdivPatches == 0) {
    if ((this->primsMB).size_active != 0) {
      (this->primsMB).size_active = 0;
    }
    (this->primsMB).size_active = 0;
    sVar6 = (this->bounds).size_alloced;
    if ((this->bounds).size_active != 0) {
      (this->bounds).size_active = 0;
    }
    if ((this->bounds).size_alloced == sVar6) {
      (this->bounds).size_active = 0;
      goto LAB_005f4e58;
    }
    pBVar5 = (this->bounds).items;
    if (sVar6 == 0) {
      sVar17 = 0;
LAB_005f4d86:
      pBVar11 = (BBox<embree::Vec3fa> *)alignedMalloc(sVar17,0x10);
    }
    else {
      pMVar8 = (this->bounds).alloc.device;
      sVar17 = sVar6 << 5;
      (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar17,0);
      if (sVar17 < 0x1c00000) goto LAB_005f4d86;
      pBVar11 = (BBox<embree::Vec3fa> *)os_malloc(sVar17,&(this->bounds).alloc.hugepages);
    }
    (this->bounds).items = pBVar11;
    lVar14 = 0x10;
    for (uVar13 = 0; uVar13 < (this->bounds).size_active; uVar13 = uVar13 + 1) {
      pBVar11 = (this->bounds).items;
      puVar2 = (undefined8 *)((long)pBVar5 + lVar14 + -0x10);
      uVar9 = puVar2[1];
      puVar3 = (undefined8 *)((long)pBVar11 + lVar14 + -0x10);
      *puVar3 = *puVar2;
      puVar3[1] = uVar9;
      puVar2 = (undefined8 *)((long)&(pBVar5->lower).field_0 + lVar14);
      uVar9 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(pBVar11->lower).field_0 + lVar14);
      *puVar3 = *puVar2;
      puVar3[1] = uVar9;
      lVar14 = lVar14 + 0x20;
    }
    sVar17 = (this->bounds).size_alloced;
    if (pBVar5 != (BBox<embree::Vec3fa> *)0x0) {
      if (sVar17 << 5 < 0x1c00000) {
        alignedFree(pBVar5);
      }
      else {
        os_free(pBVar5,sVar17 << 5,(this->bounds).alloc.hugepages);
      }
    }
    if (sVar17 != 0) {
      pMVar8 = (this->bounds).alloc.device;
      (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar17 * -0x20,1);
    }
    (this->bounds).size_active = 0;
    (this->bounds).size_alloced = sVar6;
LAB_005f4e58:
    pstate.super_ParallelForForState.i0[0] = 0x7f8000007f800000;
    pstate.super_ParallelForForState.i0[1] = 0x7f8000007f800000;
    pstate.super_ParallelForForState.i0[2] = 0xff800000ff800000;
    pstate.super_ParallelForForState.i0[3] = 0xff800000ff800000;
    pstate.super_ParallelForForState.i0[4] = 0x7f8000007f800000;
    pstate.super_ParallelForForState.i0[5] = 0x7f8000007f800000;
    pstate.super_ParallelForForState.i0[6] = 0xff800000ff800000;
    pstate.super_ParallelForForState.i0[7] = 0xff800000ff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&pstate,0);
    return;
  }
  pBVar4 = this->bvh;
  std::__cxx11::to_string((string *)&numSubPatches,4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_4c88.field_1,"sse2::BVH",(string *)&numSubPatches);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pstate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_4c88.field_1,"SubdivPatch1MBlurBuilderSAH");
  local_4cb0 = BVHN<4>::preBuild(pBVar4,(string *)&pstate);
  std::__cxx11::string::~string((string *)&pstate);
  std::__cxx11::string::~string((string *)&local_4c88.field_1);
  std::__cxx11::string::~string((string *)&numSubPatches);
  pstate.super_ParallelForForState.taskCount = 0;
  countSubPatches(this,&numSubPatches,&numSubPatchesMB,&pstate);
  sVar6 = numSubPatches;
  uVar13 = (this->primsMB).size_alloced;
  uVar15 = uVar13;
  if ((uVar13 < numSubPatches) && (uVar16 = uVar13, uVar15 = numSubPatches, uVar13 != 0)) {
    for (; uVar15 = uVar16, uVar16 < numSubPatches; uVar16 = uVar16 * 2 + (ulong)(uVar16 * 2 == 0))
    {
    }
  }
  psVar1 = &(this->primsMB).size_active;
  if (numSubPatches < (this->primsMB).size_active) {
    *psVar1 = numSubPatches;
  }
  if (uVar13 == uVar15) {
    *psVar1 = numSubPatches;
  }
  else {
    pPVar7 = (this->primsMB).items;
    if (uVar15 == 0) {
      sVar17 = 0;
LAB_005f4ac3:
      pPVar10 = (PrimRefMB *)alignedMalloc(sVar17,0x10);
    }
    else {
      pMVar8 = (this->primsMB).alloc.device;
      sVar17 = uVar15 * 0x50;
      (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar17,0);
      if (sVar17 < 0x1c00000) goto LAB_005f4ac3;
      pPVar10 = (PrimRefMB *)os_malloc(sVar17,&(this->primsMB).alloc.hugepages);
    }
    (this->primsMB).items = pPVar10;
    lVar14 = 0;
    for (uVar13 = 0; uVar13 < *psVar1; uVar13 = uVar13 + 1) {
      PrimRefMB::PrimRefMB
                ((PrimRefMB *)
                 ((long)&(((this->primsMB).items)->lbounds).bounds0.lower.field_0 + lVar14),
                 (PrimRefMB *)((long)&(pPVar7->lbounds).bounds0.lower.field_0 + lVar14));
      lVar14 = lVar14 + 0x50;
    }
    sVar17 = (this->primsMB).size_alloced;
    if (pPVar7 != (PrimRefMB *)0x0) {
      if (sVar17 * 0x50 < 0x1c00000) {
        alignedFree(pPVar7);
      }
      else {
        os_free(pPVar7,sVar17 * 0x50,(this->primsMB).alloc.hugepages);
      }
    }
    if (sVar17 != 0) {
      pMVar8 = (this->primsMB).alloc.device;
      (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar17 * -0x50,1);
    }
    (this->primsMB).size_active = sVar6;
    (this->primsMB).size_alloced = uVar15;
  }
  sVar6 = numSubPatchesMB;
  uVar13 = (this->bounds).size_alloced;
  uVar15 = uVar13;
  if ((uVar13 < numSubPatchesMB) && (uVar16 = uVar13, uVar15 = numSubPatchesMB, uVar13 != 0)) {
    for (; uVar15 = uVar16, uVar16 < numSubPatchesMB; uVar16 = uVar16 * 2 + (ulong)(uVar16 * 2 == 0)
        ) {
    }
  }
  if (numSubPatchesMB < (this->bounds).size_active) {
    (this->bounds).size_active = numSubPatchesMB;
  }
  if (uVar13 == uVar15) {
    (this->bounds).size_active = numSubPatchesMB;
    goto LAB_005f4c4f;
  }
  pBVar5 = (this->bounds).items;
  if (uVar15 == 0) {
    sVar17 = 0;
LAB_005f4bc2:
    pBVar11 = (BBox<embree::Vec3fa> *)alignedMalloc(sVar17,0x10);
  }
  else {
    pMVar8 = (this->bounds).alloc.device;
    sVar17 = uVar15 << 5;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar17,0);
    if (sVar17 < 0x1c00000) goto LAB_005f4bc2;
    pBVar11 = (BBox<embree::Vec3fa> *)os_malloc(sVar17,&(this->bounds).alloc.hugepages);
  }
  lVar14 = 0x10;
  (this->bounds).items = pBVar11;
  for (uVar13 = 0; uVar13 < (this->bounds).size_active; uVar13 = uVar13 + 1) {
    pBVar11 = (this->bounds).items;
    puVar2 = (undefined8 *)((long)pBVar5 + lVar14 + -0x10);
    uVar9 = puVar2[1];
    puVar3 = (undefined8 *)((long)pBVar11 + lVar14 + -0x10);
    *puVar3 = *puVar2;
    puVar3[1] = uVar9;
    puVar2 = (undefined8 *)((long)&(pBVar5->lower).field_0 + lVar14);
    uVar9 = puVar2[1];
    puVar3 = (undefined8 *)((long)&(pBVar11->lower).field_0 + lVar14);
    *puVar3 = *puVar2;
    puVar3[1] = uVar9;
    lVar14 = lVar14 + 0x20;
  }
  sVar17 = (this->bounds).size_alloced;
  if (pBVar5 != (BBox<embree::Vec3fa> *)0x0) {
    if (sVar17 << 5 < 0x1c00000) {
      alignedFree(pBVar5);
    }
    else {
      os_free(pBVar5,sVar17 << 5,(this->bounds).alloc.hugepages);
    }
  }
  if (sVar17 != 0) {
    pMVar8 = (this->bounds).alloc.device;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar17 * -0x20,1);
  }
  (this->bounds).size_active = sVar6;
  (this->bounds).size_alloced = uVar15;
LAB_005f4c4f:
  pBVar4 = this->bvh;
  if (numSubPatches == 0) {
    local_4c88._0_8_ = 0x7f8000007f800000;
    local_4c88._8_8_ = 0x7f8000007f800000;
    local_4c78 = 0xff800000ff800000;
    uStack_4c70 = 0xff800000ff800000;
    local_4c68 = 0x7f8000007f800000;
    uStack_4c60 = 0x7f8000007f800000;
    local_4c58 = 0xff800000ff800000;
    uStack_4c50 = 0xff800000ff800000;
    BVHN<4>::set(pBVar4,(NodeRef)0x8,(LBBox3fa *)&local_4c88.field_1,0);
  }
  else {
    uVar16 = numSubPatchesMB * 0x140;
    uVar13 = (pBVar4->subdiv_patches).size_alloced;
    uVar15 = uVar13;
    if ((uVar13 < uVar16) && (uVar18 = uVar13, uVar15 = uVar16, uVar13 != 0)) {
      for (; uVar15 = uVar18, uVar18 < uVar16; uVar18 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0)) {
      }
    }
    if (uVar16 < (pBVar4->subdiv_patches).size_active) {
      (pBVar4->subdiv_patches).size_active = uVar16;
    }
    if (uVar13 == uVar15) {
      (pBVar4->subdiv_patches).size_active = uVar16;
      ctx = (EVP_PKEY_CTX *)numSubPatches;
    }
    else {
      ptr = (pBVar4->subdiv_patches).items;
      pcVar12 = (char *)alignedMalloc(uVar15,0x20);
      (pBVar4->subdiv_patches).items = pcVar12;
      for (uVar13 = 0; uVar13 < (pBVar4->subdiv_patches).size_active; uVar13 = uVar13 + 1) {
        (pBVar4->subdiv_patches).items[uVar13] = ptr[uVar13];
      }
      alignedFree(ptr);
      (pBVar4->subdiv_patches).size_active = uVar16;
      (pBVar4->subdiv_patches).size_alloced = uVar15;
      ctx = (EVP_PKEY_CTX *)numSubPatches;
    }
    rebuild(this,(size_t)ctx,&pstate);
    if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
      sVar6 = (this->primsMB).size_alloced;
      pPVar7 = (this->primsMB).items;
      if (pPVar7 != (PrimRefMB *)0x0) {
        ctx = (EVP_PKEY_CTX *)(sVar6 * 0x50);
        if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pPVar7);
        }
        else {
          os_free(pPVar7,(size_t)ctx,(this->primsMB).alloc.hugepages);
        }
      }
      if (sVar6 != 0) {
        pMVar8 = (this->primsMB).alloc.device;
        ctx = (EVP_PKEY_CTX *)(sVar6 * -0x50);
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,ctx,1);
      }
      *psVar1 = 0;
      (this->primsMB).size_alloced = 0;
      (this->primsMB).items = (PrimRefMB *)0x0;
    }
    BVHN<4>::cleanup(this->bvh,ctx);
  }
  BVHN<4>::postBuild(this->bvh,local_4cb0);
  return;
}

Assistant:

void build() 
      {
        /* initialize all half edge structures */
        size_t numPatches = scene->getNumPrimitives(SubdivMesh::geom_type,true);

        /* skip build for empty scene */
        if (numPatches == 0) {
          primsMB.resize(0);
          bounds.resize(0);
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "SubdivPatch1MBlurBuilderSAH");

        ParallelForForPrefixSumState<PrimInfoMB> pstate;

        /* calculate number of primitives (some patches need initial subdivision) */
        size_t numSubPatches, numSubPatchesMB;
        countSubPatches(numSubPatches, numSubPatchesMB, pstate);
        primsMB.resize(numSubPatches);
        bounds.resize(numSubPatchesMB);
        
        /* exit if there are no primitives to process */
        if (numSubPatches == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          bvh->postBuild(t0);
          return;
        }
        
        /* Allocate memory for gregory and b-spline patches */
        bvh->subdiv_patches.resize(sizeof(SubdivPatch1) * numSubPatchesMB);

        /* rebuild BVH */
        rebuild(numSubPatches, pstate);
        
	/* clear temporary data for static geometry */
	if (scene->isStaticAccel()) {
          primsMB.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);        
      }